

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.c
# Opt level: O0

sexp_conflict
sexp_make_custom_port
          (sexp_conflict ctx,sexp_conflict self,char *mode,sexp_conflict read,sexp_conflict write,
          sexp_conflict seek,sexp_conflict close)

{
  sexp in_RCX;
  char *in_RDX;
  long in_RDI;
  sexp in_R8;
  sexp in_R9;
  sexp_gc_var_t __sexp_gc_preserver2;
  sexp_conflict str;
  sexp_gc_var_t __sexp_gc_preserver1;
  sexp_conflict res;
  sexp_conflict vec;
  sexp_conflict *local_70;
  undefined8 local_68;
  sexp_conflict local_60;
  sexp_conflict *local_58;
  undefined8 local_50;
  sexp_conflict local_48 [2];
  sexp local_38;
  sexp local_30;
  sexp local_28;
  char *local_20;
  long local_10;
  sexp_conflict local_8;
  
  local_48[0] = (sexp_conflict)0x43e;
  local_38 = in_R9;
  local_30 = in_R8;
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_10 = in_RDI;
  memset(&local_58,0,0x10);
  local_60 = (sexp_conflict)0x43e;
  memset(&local_70,0,0x10);
  local_58 = local_48;
  local_50 = *(undefined8 *)(local_10 + 0x6080);
  *(sexp_conflict ***)(local_10 + 0x6080) = &local_58;
  local_70 = &local_60;
  local_68 = *(undefined8 *)(local_10 + 0x6080);
  *(sexp_conflict ***)(local_10 + 0x6080) = &local_70;
  local_60 = (sexp_conflict)sexp_make_string_op(local_10,0,2,0x2001,0x43e);
  if (((((ulong)local_60 & 3) != 0) || (local_8 = local_60, local_60->tag != 0x13)) &&
     ((local_48[0] = (sexp_conflict)sexp_open_input_string_op(local_10,0,1,local_60),
      ((ulong)local_48[0] & 3) != 0 || (local_8 = local_48[0], local_48[0]->tag != 0x13)))) {
    if ((local_20 == (char *)0x0) || (*local_20 != 'w')) {
      (local_48[0]->value).type.print = (sexp)0x0;
      (local_48[0]->value).port.size = 0;
    }
    else {
      local_48[0]->tag = 0x11;
      (local_48[0]->value).type.cpl = local_60;
    }
    local_8 = (sexp_conflict)sexp_make_vector_op(local_10,0,2,0xd,0x43e);
    if ((((ulong)local_8 & 3) != 0) || (local_8->tag != 0x13)) {
      (local_8->value).string.offset = 0x3e;
      (local_8->value).type.slots = (local_48[0]->value).type.cpl;
      (local_8->value).type.getters = local_28;
      (local_8->value).type.setters = local_30;
      (local_8->value).type.id = local_38;
      (local_8->value).type.print = (sexp)__sexp_gc_preserver2.var;
      (local_48[0]->value).type.cpl = local_8;
      *(undefined8 *)(local_10 + 0x6080) = local_50;
      local_8 = local_48[0];
    }
  }
  return local_8;
}

Assistant:

static sexp sexp_make_custom_port (sexp ctx, sexp self,
                                   const char *mode, sexp read, sexp write,
                                   sexp seek, sexp close) {
  sexp vec;
  sexp_gc_var2(res, str);
  sexp_gc_preserve2(ctx, res, str);
  str = sexp_make_string(ctx, sexp_make_fixnum(SEXP_PORT_BUFFER_SIZE), SEXP_VOID);
  if (sexp_exceptionp(str)) return str;
  res = sexp_open_input_string(ctx, str);
  if (sexp_exceptionp(res)) return res;
  if (mode && mode[0] == 'w') {
    sexp_pointer_tag(res) = SEXP_OPORT;
    sexp_port_cookie(res) = str;
  } else {
    sexp_port_offset(res) = 0;
    sexp_port_size(res) = 0;
  }
  vec = sexp_make_vector(ctx, SEXP_SIX, SEXP_VOID);
  if (sexp_exceptionp(vec)) return vec;
  sexp_vector_set(vec, SEXP_ZERO, SEXP_FALSE);
  sexp_vector_set(vec, SEXP_ONE, sexp_port_cookie(res));
  sexp_vector_set(vec, SEXP_TWO, read);
  sexp_vector_set(vec, SEXP_THREE, write);
  sexp_vector_set(vec, SEXP_FOUR, seek);
  sexp_vector_set(vec, SEXP_FIVE, close);
  sexp_port_cookie(res) = vec;
  sexp_gc_release2(ctx);
  return res;
}